

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_dict.cc
# Opt level: O0

bool brotli::IsMatch(DictWord w,uint8_t *data,size_t max_length)

{
  ulong uVar1;
  byte *s1;
  size_t sVar2;
  bool local_39;
  ulong local_38;
  size_t i;
  uint8_t *dict;
  size_t offset;
  size_t max_length_local;
  uint8_t *data_local;
  DictWord w_local;
  
  data_local._2_1_ = w.len;
  if (max_length < data_local._2_1_) {
    data_local._7_1_ = false;
  }
  else {
    uVar1 = (ulong)(kBrotliDictionaryOffsetsByLength[data_local._2_1_] +
                   ((uint)w & 0xff) * ((uint)w >> 0x10));
    s1 = kBrotliDictionary + uVar1;
    data_local._3_1_ = w.transform;
    if (data_local._3_1_ == '\0') {
      sVar2 = FindMatchLengthWithLimit(s1,data,(ulong)data_local._2_1_);
      data_local._7_1_ = sVar2 == data_local._2_1_;
    }
    else if (data_local._3_1_ == '\n') {
      local_39 = false;
      if (((0x60 < *s1) && (local_39 = false, *s1 < 0x7b)) &&
         (local_39 = false, (*s1 ^ 0x20) == *data)) {
        sVar2 = FindMatchLengthWithLimit
                          (kBrotliDictionary + uVar1 + 1,data + 1,(ulong)(((uint)w & 0xff) - 1));
        local_39 = sVar2 == ((uint)w & 0xff) - 1;
      }
      data_local._7_1_ = local_39;
    }
    else {
      for (local_38 = 0; local_38 < data_local._2_1_; local_38 = local_38 + 1) {
        if ((s1[local_38] < 0x61) || (0x7a < s1[local_38])) {
          if (s1[local_38] != data[local_38]) {
            return false;
          }
        }
        else if ((s1[local_38] ^ 0x20) != data[local_38]) {
          return false;
        }
      }
      data_local._7_1_ = true;
    }
  }
  return data_local._7_1_;
}

Assistant:

inline bool IsMatch(DictWord w, const uint8_t* data, size_t max_length) {
  if (w.len > max_length) return false;
  const size_t offset = kBrotliDictionaryOffsetsByLength[w.len] + w.len * w.idx;
  const uint8_t* dict = &kBrotliDictionary[offset];
  if (w.transform == 0) {
    // Match against base dictionary word.
    return FindMatchLengthWithLimit(dict, data, w.len) == w.len;
  } else if (w.transform == 10) {
    // Match against uppercase first transform.
    // Note that there are only ASCII uppercase words in the lookup table.
    return (dict[0] >= 'a' && dict[0] <= 'z' &&
            (dict[0] ^ 32) == data[0] &&
            FindMatchLengthWithLimit(&dict[1], &data[1], w.len - 1u) ==
            w.len - 1u);
  } else {
    // Match against uppercase all transform.
    // Note that there are only ASCII uppercase words in the lookup table.
    for (size_t i = 0; i < w.len; ++i) {
      if (dict[i] >= 'a' && dict[i] <= 'z') {
        if ((dict[i] ^ 32) != data[i]) return false;
      } else {
        if (dict[i] != data[i]) return false;
      }
    }
    return true;
  }
}